

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLNode::Unlink(XMLNode *this,XMLNode *child)

{
  XMLNode *child_local;
  XMLNode *this_local;
  
  if (child == this->_firstChild) {
    this->_firstChild = this->_firstChild->_next;
  }
  if (child == this->_lastChild) {
    this->_lastChild = this->_lastChild->_prev;
  }
  if (child->_prev != (XMLNode *)0x0) {
    child->_prev->_next = child->_next;
  }
  if (child->_next != (XMLNode *)0x0) {
    child->_next->_prev = child->_prev;
  }
  child->_parent = (XMLNode *)0x0;
  return;
}

Assistant:

void XMLNode::Unlink( XMLNode* child )
{
    TIXMLASSERT( child );
    TIXMLASSERT( child->_document == _document );
    TIXMLASSERT( child->_parent == this );
    if ( child == _firstChild ) {
        _firstChild = _firstChild->_next;
    }
    if ( child == _lastChild ) {
        _lastChild = _lastChild->_prev;
    }

    if ( child->_prev ) {
        child->_prev->_next = child->_next;
    }
    if ( child->_next ) {
        child->_next->_prev = child->_prev;
    }
	child->_parent = 0;
}